

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O1

void __thiscall AixLog::SinkFormat::SinkFormat(SinkFormat *this,Filter *filter,string *format)

{
  pointer pcVar1;
  
  (this->super_Sink)._vptr_Sink = (_func_int **)&PTR__Sink_001eed58;
  std::
  _Rb_tree<AixLog::Tag,_std::pair<const_AixLog::Tag,_AixLog::Severity>,_std::_Select1st<std::pair<const_AixLog::Tag,_AixLog::Severity>_>,_std::less<AixLog::Tag>,_std::allocator<std::pair<const_AixLog::Tag,_AixLog::Severity>_>_>
  ::_Rb_tree((_Rb_tree<AixLog::Tag,_std::pair<const_AixLog::Tag,_AixLog::Severity>,_std::_Select1st<std::pair<const_AixLog::Tag,_AixLog::Severity>_>,_std::less<AixLog::Tag>,_std::allocator<std::pair<const_AixLog::Tag,_AixLog::Severity>_>_>
              *)&(this->super_Sink).filter,
             (_Rb_tree<AixLog::Tag,_std::pair<const_AixLog::Tag,_AixLog::Severity>,_std::_Select1st<std::pair<const_AixLog::Tag,_AixLog::Severity>_>,_std::less<AixLog::Tag>,_std::allocator<std::pair<const_AixLog::Tag,_AixLog::Severity>_>_>
              *)filter);
  (this->super_Sink)._vptr_Sink = (_func_int **)&PTR__SinkFormat_001eed20;
  (this->format_)._M_dataplus._M_p = (pointer)&(this->format_).field_2;
  pcVar1 = (format->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->format_,pcVar1,pcVar1 + format->_M_string_length);
  return;
}

Assistant:

SinkFormat(const Filter& filter, const std::string& format)
      : Sink(filter), format_(format) {}